

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O1

ThreeAxisForceTorqueContactSensor * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::computeCenterOfPressureFromLoadCellMeasurements
          (ThreeAxisForceTorqueContactSensor *this,VectorDynSize *loadCellMeasurements)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  VectorDynSize *in_RDX;
  char *pcVar7;
  Position *zeroVec;
  ulong uVar8;
  ThreeAxisForceTorqueContactSensor TVar9;
  double local_58;
  double local_48;
  double local_38;
  double dStack_30;
  
  lVar4 = iDynTree::VectorDynSize::size();
  if (lVar4 == (*(long *)(*(long *)(loadCellMeasurements + 8) + 0xb0) -
                *(long *)(*(long *)(loadCellMeasurements + 8) + 0xa8) >> 3) * -0x5555555555555555) {
    lVar4 = iDynTree::VectorDynSize::size();
    if (lVar4 == 0) {
      local_38 = 0.0;
      dStack_30 = 0.0;
      local_48 = 0.0;
      local_58 = 0.0;
    }
    else {
      local_38 = 0.0;
      dStack_30 = 0.0;
      local_58 = 0.0;
      lVar4 = 0x10;
      uVar8 = 0;
      local_48 = 0.0;
      do {
        pdVar5 = (double *)iDynTree::VectorDynSize::operator()(in_RDX,uVar8);
        local_58 = local_58 + *pdVar5;
        pdVar5 = (double *)iDynTree::VectorDynSize::operator()(in_RDX,uVar8);
        dVar1 = *pdVar5;
        pdVar5 = (double *)(*(long *)(*(long *)(loadCellMeasurements + 8) + 0xa8) + -0x10 + lVar4);
        local_38 = local_38 + *pdVar5 * dVar1;
        dStack_30 = dStack_30 + pdVar5[1] * dVar1;
        local_48 = local_48 +
                   dVar1 * *(double *)
                            (*(long *)(*(long *)(loadCellMeasurements + 8) + 0xa8) + lVar4);
        uVar8 = uVar8 + 1;
        uVar6 = iDynTree::VectorDynSize::size();
        lVar4 = lVar4 + 0x18;
      } while (uVar8 < uVar6);
    }
    if (1e-09 <= local_58) {
      iDynTree::Position::Position((Position *)this);
      auVar3._8_8_ = dStack_30;
      auVar3._0_8_ = local_38;
      auVar2._8_8_ = local_58;
      auVar2._0_8_ = local_58;
      TVar9 = (ThreeAxisForceTorqueContactSensor)divpd(auVar3,auVar2);
      *this = TVar9;
      this[1].super_LinkSensor.super_Sensor._vptr_Sensor = (_func_int **)(local_48 / local_58);
      return this;
    }
    pcVar7 = "loadCellMeasurements sum is less than 1e-9";
  }
  else {
    pcVar7 = "loadCellMeasurements has the wrong size";
  }
  iDynTree::reportError
            ("ThreeAxisForceTorqueContactSensor",
             "computeThreeAxisForceTorqueFromLoadCellMeasurements",pcVar7);
  iDynTree::Position::Position((Position *)this);
  (this->super_LinkSensor).super_Sensor._vptr_Sensor = (_func_int **)0x0;
  this->pimpl = (ThreeAxisForceTorqueContactSensorPrivateAttributes *)0x0;
  this[1].super_LinkSensor.super_Sensor._vptr_Sensor = (_func_int **)0x0;
  return this;
}

Assistant:

Position ThreeAxisForceTorqueContactSensor::computeCenterOfPressureFromLoadCellMeasurements(VectorDynSize& loadCellMeasurements) const
{
    if (loadCellMeasurements.size() != pimpl->m_loadCellLocations.size())
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements has the wrong size");
        Position zeroVec; zeroVec.zero();
        return zeroVec;
    }

    // We assume that the location of the load cells is on the XY plane. In this case, the cop is just the average of the locations weighted on the measurements
    double sumOfMeasurementsInN=0.0;
    Vector3 weightedSumOfLocations; weightedSumOfLocations.zero();
    for (size_t i=0; i < loadCellMeasurements.size(); i++)
    {
        sumOfMeasurementsInN += loadCellMeasurements(i);
        toEigen(weightedSumOfLocations) += loadCellMeasurements(i)*toEigen(pimpl->m_loadCellLocations[i]);
    }

    if (sumOfMeasurementsInN < 1e-9)
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements sum is less than 1e-9");
        Position zeroVec; zeroVec.zero();
        return zeroVec;
    }

    Position ret;
    toEigen(ret) = toEigen(weightedSumOfLocations)/sumOfMeasurementsInN;
    return ret;
}